

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBac.c
# Opt level: O3

int BacManReadBacNameAndNums(char *pBuffer,int *Num1,int *Num2,int *Num3,int *Num4)

{
  int iVar1;
  char *pcVar2;
  
  *Num4 = -1;
  *Num3 = -1;
  *Num2 = -1;
  *Num1 = -1;
  do {
    pcVar2 = pBuffer;
    pBuffer = pcVar2 + 1;
    if (*pcVar2 == '\0') {
      return 0;
    }
  } while (*pcVar2 != ' ');
  *pcVar2 = '\0';
  iVar1 = atoi(pBuffer);
  *Num1 = iVar1;
  do {
    pcVar2 = pBuffer;
    if (*pcVar2 == '\0') {
      return 0;
    }
    pBuffer = pcVar2 + 1;
  } while (*pcVar2 != ' ');
  iVar1 = atoi(pcVar2 + 1);
  *Num2 = iVar1;
  pcVar2 = pcVar2 + 3;
  while( true ) {
    if (pcVar2[-2] == '\0') {
      return 1;
    }
    if (pcVar2[-2] == ' ') break;
    pcVar2 = pcVar2 + 1;
  }
  iVar1 = atoi(pcVar2 + -1);
  *Num3 = iVar1;
  while( true ) {
    if (pcVar2[-1] == '\0') {
      return 1;
    }
    if (pcVar2[-1] == ' ') break;
    pcVar2 = pcVar2 + 1;
  }
  iVar1 = atoi(pcVar2);
  *Num4 = iVar1;
  return 1;
}

Assistant:

int BacManReadBacNameAndNums( char * pBuffer, int * Num1, int * Num2, int * Num3, int * Num4 )
{
    *Num1 = *Num2 = *Num3 = *Num4 = -1;
    // read name
    while ( *pBuffer && *pBuffer != ' ' )
        pBuffer++;
    if ( !*pBuffer )
        return 0;
    assert( *pBuffer == ' ' );
    *pBuffer = 0;
    // read Num1
    *Num1 = atoi(++pBuffer);
    while ( *pBuffer && *pBuffer != ' ' )
        pBuffer++;
    if ( !*pBuffer )
        return 0;
    // read Num2
    assert( *pBuffer == ' ' );
    *Num2 = atoi(++pBuffer);
    while ( *pBuffer && *pBuffer != ' ' )
        pBuffer++;
    if ( !*pBuffer )
        return 1;
    // read Num3
    assert( *pBuffer == ' ' );
    *Num3 = atoi(++pBuffer);
    while ( *pBuffer && *pBuffer != ' ' )
        pBuffer++;
    if ( !*pBuffer )
        return 1;
    // read Num4
    assert( *pBuffer == ' ' );
    *Num4 = atoi(++pBuffer);
    return 1;
}